

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPixelBufferObjectTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::anon_unknown_0::ReadPixelsTest::init
          (ReadPixelsTest *this,EVP_PKEY_CTX *ctx)

{
  GLenum GVar1;
  RenderContext *renderCtx;
  bool bVar2;
  int iVar3;
  GLubyte *pGVar4;
  istream *piVar5;
  ostream *poVar6;
  ShaderProgram *this_00;
  NotSupportedError *this_01;
  TestError *this_02;
  allocator<char> local_2e9;
  string outtype;
  string local_2c8;
  string local_2a8;
  string extension;
  stringstream fragmentShaderSource;
  ostream local_1a8;
  
  if (this->m_framebuffeType != FRAMEBUFFERTYPE_RENDERBUFFER) goto LAB_01049582;
  GVar1 = this->m_renderbufferFormat;
  if (GVar1 == 0x822f) {
LAB_01049428:
    pGVar4 = glwGetString(0x1f03);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&extension,(char *)pGVar4,(allocator<char> *)&outtype);
    std::__cxx11::istringstream::istringstream
              ((istringstream *)&fragmentShaderSource,(string *)&extension,_S_in);
    std::__cxx11::string::~string((string *)&extension);
    extension._M_dataplus._M_p = (pointer)&extension.field_2;
    extension._M_string_length = 0;
    extension.field_2._M_local_buf[0] = '\0';
    do {
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&fragmentShaderSource,(string *)&extension,' ');
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) goto LAB_01049708;
      bVar2 = std::operator==(&extension,"GL_EXT_color_buffer_half_float");
    } while ((!bVar2) && (bVar2 = std::operator==(&extension,"GL_EXT_color_buffer_float"), !bVar2));
  }
  else {
    if (((GVar1 != 0x8230) && (GVar1 != 0x8814)) && (GVar1 != 0x8c3a)) {
      if (GVar1 != 0x881a) goto LAB_01049582;
      goto LAB_01049428;
    }
    pGVar4 = glwGetString(0x1f03);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&extension,(char *)pGVar4,(allocator<char> *)&outtype);
    std::__cxx11::istringstream::istringstream
              ((istringstream *)&fragmentShaderSource,(string *)&extension,_S_in);
    std::__cxx11::string::~string((string *)&extension);
    extension._M_dataplus._M_p = (pointer)&extension.field_2;
    extension._M_string_length = 0;
    extension.field_2._M_local_buf[0] = '\0';
    do {
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&fragmentShaderSource,(string *)&extension,' ');
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) {
LAB_01049708:
        std::__cxx11::string::~string((string *)&extension);
        std::__cxx11::istringstream::~istringstream((istringstream *)&fragmentShaderSource);
        this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (this_01,"Renderbuffer format not supported",
                   glcts::fixed_sample_locations_values + 1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fPixelBufferObjectTests.cpp"
                   ,0xcb);
        __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
      bVar2 = std::operator==(&extension,"GL_EXT_color_buffer_float");
    } while (!bVar2);
  }
  std::__cxx11::string::~string((string *)&extension);
  std::__cxx11::istringstream::~istringstream((istringstream *)&fragmentShaderSource);
LAB_01049582:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&outtype,glcts::fixed_sample_locations_values + 1,
             (allocator<char> *)&fragmentShaderSource);
  if ((this->m_framebuffeType == FRAMEBUFFERTYPE_NATIVE) ||
     ((this->m_framebuffeType == FRAMEBUFFERTYPE_RENDERBUFFER &&
      (this->m_texChannelClass - TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT < 4)))) {
    std::__cxx11::string::assign((char *)&outtype);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&fragmentShaderSource);
  std::operator<<(&local_1a8,"#version 300 es\nin mediump vec4 v_color;\n");
  poVar6 = std::operator<<(&local_1a8,"layout (location = 0) out mediump ");
  poVar6 = std::operator<<(poVar6,(string *)&outtype);
  poVar6 = std::operator<<(poVar6," o_color;\nvoid main(void)\n{\n\to_color = ");
  poVar6 = std::operator<<(poVar6,(string *)&outtype);
  std::operator<<(poVar6,"(v_color);\n}");
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,
             "#version 300 es\nin mediump vec3 a_position;\nin mediump vec4 a_color;\nuniform mediump float u_colorScale;\nout mediump vec4 v_color;\nvoid main(void)\n{\n\tgl_Position = vec4(a_position, 1.0);\n\tv_color = u_colorScale * a_color;\n}"
             ,&local_2e9);
  std::__cxx11::stringbuf::str();
  glu::makeVtxFragSources((ProgramSources *)&extension,&local_2a8,&local_2c8);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,(ProgramSources *)&extension);
  this->m_program = this_00;
  glu::ProgramSources::~ProgramSources((ProgramSources *)&extension);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2a8);
  if ((this->m_program->m_program).m_info.linkOk == false) {
    glu::operator<<(this->m_log,this->m_program);
    this_02 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_02,"Failed to compile shader",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fPixelBufferObjectTests.cpp"
               ,0x10c);
    __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&fragmentShaderSource);
  iVar3 = std::__cxx11::string::~string((string *)&outtype);
  return iVar3;
}

Assistant:

void ReadPixelsTest::init (void)
{
	// Check extensions
	if (m_framebuffeType == TestSpec::FRAMEBUFFERTYPE_RENDERBUFFER)
	{
		bool supported = false;

		if (m_renderbufferFormat == GL_RGBA16F
			|| m_renderbufferFormat == GL_RG16F)
		{
			std::istringstream extensions(std::string((const char*)glGetString(GL_EXTENSIONS)));
			std::string extension;

			while (std::getline(extensions, extension, ' '))
			{
				if (extension=="GL_EXT_color_buffer_half_float")
				{
					supported = true;
					break;
				}
				if (extension=="GL_EXT_color_buffer_float")
				{
					supported = true;
					break;
				}
			}
		}
		else if (m_renderbufferFormat == GL_RGBA32F
				|| m_renderbufferFormat == GL_RG32F
				|| m_renderbufferFormat == GL_R11F_G11F_B10F)
		{
			std::istringstream extensions(std::string((const char*)glGetString(GL_EXTENSIONS)));
			std::string extension;

			while (std::getline(extensions, extension, ' '))
			{
				if (extension=="GL_EXT_color_buffer_float")
				{
					supported = true;
					break;
				}
			}
		}
		else
			supported = true;

		if (!supported)
			throw tcu::NotSupportedError("Renderbuffer format not supported", "", __FILE__, __LINE__);
	}

	std::string outtype = "";

	if (m_framebuffeType == TestSpec::FRAMEBUFFERTYPE_NATIVE)
		outtype = "vec4";
	else if (m_framebuffeType == TestSpec::FRAMEBUFFERTYPE_RENDERBUFFER)
	{
		switch (m_texChannelClass)
		{
			case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
				outtype = "vec4";
				break;

			case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
				outtype = "ivec4";
				break;

			case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
				outtype = "uvec4";
				break;

			case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
				outtype = "vec4";
				break;

			default:
				DE_ASSERT(false);
		}
	}
	else
		DE_ASSERT(false);


	const char* vertexShaderSource =
	"#version 300 es\n"
	"in mediump vec3 a_position;\n"
	"in mediump vec4 a_color;\n"
	"uniform mediump float u_colorScale;\n"
	"out mediump vec4 v_color;\n"
	"void main(void)\n"
	"{\n"
	"\tgl_Position = vec4(a_position, 1.0);\n"
	"\tv_color = u_colorScale * a_color;\n"
	"}";

	stringstream fragmentShaderSource;

	fragmentShaderSource <<
	"#version 300 es\n"
	"in mediump vec4 v_color;\n";


	fragmentShaderSource << "layout (location = 0) out mediump " << outtype << " o_color;\n"
	"void main(void)\n"
	"{\n"
	"\to_color = " << outtype << "(v_color);\n"
	"}";

	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::makeVtxFragSources(vertexShaderSource, fragmentShaderSource.str()));

	if (!m_program->isOk())
	{
		m_log << *m_program;
		TCU_FAIL("Failed to compile shader");
	}
}